

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TestAllTypesLite::set_allocated_oneof_lazy_nested_message
          (TestAllTypesLite *this,TestAllTypesLite_NestedMessage *oneof_lazy_nested_message)

{
  Arena *submessage_arena;
  Arena *message_arena;
  
  message_arena = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)message_arena & 1) != 0) {
    message_arena = *(Arena **)((ulong)message_arena & 0xfffffffffffffffe);
  }
  clear_oneof_field(this);
  if (oneof_lazy_nested_message != (TestAllTypesLite_NestedMessage *)0x0) {
    submessage_arena =
         (Arena *)(oneof_lazy_nested_message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 1) != 0) {
      submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffe);
    }
    if (message_arena != submessage_arena) {
      oneof_lazy_nested_message =
           (TestAllTypesLite_NestedMessage *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&oneof_lazy_nested_message->super_MessageLite,submessage_arena);
    }
    (this->field_0)._impl_._oneof_case_[0] = 0x73;
    (this->field_0)._impl_.oneof_field_.oneof_nested_message_ =
         &oneof_lazy_nested_message->super_MessageLite;
  }
  return;
}

Assistant:

void TestAllTypesLite::set_allocated_oneof_lazy_nested_message(::proto2_unittest::TestAllTypesLite_NestedMessage* PROTOBUF_NULLABLE oneof_lazy_nested_message) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (oneof_lazy_nested_message) {
    ::google::protobuf::Arena* submessage_arena = oneof_lazy_nested_message->GetArena();
    if (message_arena != submessage_arena) {
      oneof_lazy_nested_message = ::google::protobuf::internal::GetOwnedMessage(message_arena, oneof_lazy_nested_message, submessage_arena);
    }
    set_has_oneof_lazy_nested_message();
    _impl_.oneof_field_.oneof_lazy_nested_message_ = oneof_lazy_nested_message;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.TestAllTypesLite.oneof_lazy_nested_message)
}